

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::StringAppend(VirtualMachine *this)

{
  element_type *peVar1;
  string *val;
  Variable VVar2;
  Variable var;
  string local_60;
  anon_union_8_6_52c89740_for_Variable_1 local_40;
  VariableType local_34;
  
  VVar2 = popOpStack(this);
  local_40 = VVar2.field_1;
  local_34 = VVar2.type;
  VVar2 = popOpStack(this);
  val = Heap::NewString_abi_cxx11_(&this->heap);
  val->_M_string_length = 0;
  *(val->_M_dataplus)._M_p = '\0';
  var._4_4_ = 0;
  var.type = VVar2.type;
  var.field_1.integerValue = VVar2.field_1.integerValue;
  variableToString_abi_cxx11_(&local_60,this,var,true);
  std::__cxx11::string::append((string *)val);
  std::__cxx11::string::~string((string *)&local_60);
  VVar2._4_4_ = 0;
  VVar2.type = local_34;
  VVar2.field_1.integerValue = local_40.integerValue;
  variableToString_abi_cxx11_(&local_60,this,VVar2,true);
  std::__cxx11::string::append((string *)val);
  std::__cxx11::string::~string((string *)&local_60);
  pushString(this,val);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::StringAppend() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  auto str = this->heap.NewString();

  str->clear();

  str->append(this->variableToString(first, true));
  str->append(this->variableToString(second, true));

  this->pushString(str);
  this->advance();
}